

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
          (ExtensionSet *this,int start_field_number,int end_field_number,uint8 *target,
          EpsCopyOutputStream *stream)

{
  bool bVar1;
  bool bVar2;
  pointer ppVar3;
  KeyValue *pKVar4;
  KeyValue *pKVar5;
  uint8 *in_RCX;
  int in_EDX;
  ExtensionSet *in_RDI;
  KeyValue *it_1;
  KeyValue *end;
  iterator it;
  iterator *end_1;
  EpsCopyOutputStream *in_stack_000001d0;
  uint8 *in_stack_000001d8;
  int in_stack_000001e4;
  Extension *in_stack_000001e8;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  Extension *this_00;
  KeyValue *local_50;
  _Self local_40;
  _Self local_38;
  _Self *local_30;
  uint8 *local_20;
  int local_18;
  undefined1 local_14 [12];
  uint8 *local_8;
  
  local_20 = in_RCX;
  local_18 = in_EDX;
  bVar1 = is_large(in_RDI);
  if (bVar1) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
         ::end((map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    local_30 = &local_38;
    local_40._M_node =
         (_Base_ptr)
         std::
         map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
         ::lower_bound((map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                       (key_type_conflict *)0x49b726);
    while( true ) {
      bVar2 = std::operator!=(&local_40,local_30);
      bVar1 = false;
      if (bVar2) {
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                               *)0x49b753);
        bVar1 = ppVar3->first < local_18;
      }
      if (!bVar1) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                             *)0x49b774);
      this_00 = &ppVar3->second;
      std::
      _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                    *)0x49b787);
      local_20 = Extension::InternalSerializeFieldWithCachedSizesToArray
                           (in_stack_000001e8,in_stack_000001e4,in_stack_000001d8,in_stack_000001d0)
      ;
      std::
      _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                    *)this_00);
    }
    local_8 = local_20;
  }
  else {
    pKVar4 = flat_end(in_RDI);
    pKVar5 = flat_begin(in_RDI);
    local_50 = std::
               lower_bound<google::protobuf::internal::ExtensionSet::KeyValue_const*,int,google::protobuf::internal::ExtensionSet::KeyValue::FirstComparator>
                         (pKVar5,pKVar4,local_14);
    while( true ) {
      bVar1 = false;
      if (local_50 != pKVar4) {
        bVar1 = local_50->first < local_18;
      }
      if (!bVar1) break;
      local_20 = Extension::InternalSerializeFieldWithCachedSizesToArray
                           (in_stack_000001e8,in_stack_000001e4,in_stack_000001d8,in_stack_000001d0)
      ;
      local_50 = local_50 + 1;
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

uint8* ExtensionSet::InternalSerializeWithCachedSizesToArray(
    int start_field_number, int end_field_number, uint8* target,
    io::EpsCopyOutputStream* stream) const {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    const auto& end = map_.large->end();
    for (auto it = map_.large->lower_bound(start_field_number);
         it != end && it->first < end_field_number; ++it) {
      target = it->second.InternalSerializeFieldWithCachedSizesToArray(
          it->first, target, stream);
    }
    return target;
  }
  const KeyValue* end = flat_end();
  for (const KeyValue* it = std::lower_bound(
           flat_begin(), end, start_field_number, KeyValue::FirstComparator());
       it != end && it->first < end_field_number; ++it) {
    target = it->second.InternalSerializeFieldWithCachedSizesToArray(
        it->first, target, stream);
  }
  return target;
}